

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O1

char * Cba_ManGetSliceName(Cba_Ntk_t *p,int iFon,int RangeId)

{
  char cVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  char *pcVar4;
  Vec_Str_t *p_00;
  byte *pbVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  
  uVar7 = 0;
  uVar8 = 0;
  if (RangeId != 0) {
    if (RangeId < 0) goto LAB_0034e852;
    pVVar2 = p->pDesign->vHash->vObjs;
    if (pVVar2->nSize <= RangeId * 4) goto LAB_0034e852;
    uVar8 = pVVar2->pArray[(uint)(RangeId * 4)];
  }
  if (RangeId != 0) {
    if (RangeId < 0) {
LAB_0034e852:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
    pVVar2 = p->pDesign->vHash->vObjs;
    if (pVVar2->nSize <= RangeId * 4) goto LAB_0034e852;
    uVar7 = pVVar2->pArray[(ulong)(uint)(RangeId * 4) + 1];
  }
  if ((p->vFonName).nSize < 1) {
    pcVar4 = "Cba_NtkHasFonNames(p)";
LAB_0034e8a0:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                  ,0x18b,"char *Cba_FonNameStr(Cba_Ntk_t *, int)");
  }
  if (iFon < 1) {
    pcVar4 = "Cba_FonIsReal(f)";
    goto LAB_0034e8a0;
  }
  iVar3 = Vec_IntGetEntry(&p->vFonName,iFon);
  pcVar4 = Abc_NamStr(p->pDesign->pStrs,iVar3);
  if ((p->vFonName).nSize < 1) {
    __assert_fail("Cba_NtkHasFonNames(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                  ,0x18a,"int Cba_FonName(Cba_Ntk_t *, int)");
  }
  iVar3 = Vec_IntGetEntry(&p->vFonName,iFon);
  if (pcVar4 == (char *)0x0) {
LAB_0034e871:
    __assert_fail("pName != NULL && *pName != \'\\0\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaWriteVer.c"
                  ,0x15d,"int Cba_NameIsLegalInVerilog(char *, int)");
  }
  cVar1 = *pcVar4;
  if (cVar1 != '\\') {
    if (cVar1 == '\0') goto LAB_0034e871;
    if ((iVar3 < 0xd) ||
       (((byte)(cVar1 + 0x85U) < 0xe6 && (cVar1 != '_' && 0x19 < (byte)(cVar1 + 0xbfU))))) {
LAB_0034e77e:
      p_00 = Abc_NamBuffer(p->pDesign->pStrs);
      if (uVar8 != uVar7) {
        pcVar9 = "\\%s [%d:%d]";
        goto LAB_0034e832;
      }
      pcVar9 = "\\%s [%d]";
      goto LAB_0034e805;
    }
    bVar6 = pcVar4[1];
    if (bVar6 != 0) {
      pbVar5 = (byte *)(pcVar4 + 2);
      do {
        if (((((byte)(bVar6 - 0x3a) < 0xf6) && ((byte)((bVar6 & 0xdf) + 0xa5) < 0xe6)) &&
            (bVar6 != 0x5f)) && (bVar6 != 0x24)) goto LAB_0034e77e;
        bVar6 = *pbVar5;
        pbVar5 = pbVar5 + 1;
      } while (bVar6 != 0);
    }
  }
  p_00 = Abc_NamBuffer(p->pDesign->pStrs);
  if (uVar8 != uVar7) {
    pcVar9 = "%s[%d:%d]";
LAB_0034e832:
    pcVar4 = Vec_StrPrintF(p_00,pcVar9,pcVar4,(ulong)uVar8,(ulong)uVar7);
    return pcVar4;
  }
  pcVar9 = "%s[%d]";
LAB_0034e805:
  pcVar4 = Vec_StrPrintF(p_00,pcVar9,pcVar4,(ulong)uVar7);
  return pcVar4;
}

Assistant:

char * Cba_ManGetSliceName( Cba_Ntk_t * p, int iFon, int RangeId )
{
    int Left  = Cba_NtkRangeLeft(p, RangeId);
    int Right = Cba_NtkRangeRight(p, RangeId);
    char * pName = Cba_FonNameStr(p, iFon);
    if ( Cba_NameIsLegalInVerilog(pName, Cba_FonName(p, iFon)) )
        if ( Left == Right )
            return Vec_StrPrintF( Abc_NamBuffer(Cba_NtkNam(p)), "%s[%d]", pName, Right );
        else
            return Vec_StrPrintF( Abc_NamBuffer(Cba_NtkNam(p)), "%s[%d:%d]", pName, Left, Right );
    else
        if ( Left == Right )
            return Vec_StrPrintF( Abc_NamBuffer(Cba_NtkNam(p)), "\\%s [%d]", pName, Right );
        else
            return Vec_StrPrintF( Abc_NamBuffer(Cba_NtkNam(p)), "\\%s [%d:%d]", pName, Left, Right );
}